

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O3

void vk::BinaryRegistryDetail::BinaryIndexHashImpl_delete
               (BinaryIndexHashImpl *hash,ProgramBinary *key)

{
  BinaryIndexHashImplSlot *pBVar1;
  pointer puVar2;
  pointer puVar3;
  BinaryIndexHashImplSlot *pBVar4;
  deUint32 dVar5;
  deBool dVar6;
  BinaryIndexHashImplSlot **ppBVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  BinaryIndexHashImplSlot *pBVar11;
  BinaryIndexHashImplSlot *pBVar12;
  size_t sVar13;
  pointer cmp;
  pointer puVar14;
  pointer puVar15;
  
  puVar14 = (key->m_binary).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start;
  puVar15 = (pointer)0x0;
  sVar13 = (long)(key->m_binary).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar14;
  if (sVar13 == 0) {
    puVar14 = puVar15;
  }
  dVar5 = deMemoryHash(puVar14,sVar13);
  uVar8 = hash->slotTableSize - 1U & dVar5;
  ppBVar7 = hash->slotTable + (int)uVar8;
  pBVar11 = (BinaryIndexHashImplSlot *)0x0;
  do {
    pBVar1 = *ppBVar7;
    iVar9 = pBVar1->numUsed;
    if (0 < iVar9) {
      lVar10 = 0;
      do {
        puVar14 = (pBVar1->keys[lVar10]->m_binary).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar2 = (pBVar1->keys[lVar10]->m_binary).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        cmp = (key->m_binary).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start;
        puVar3 = (key->m_binary).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        sVar13 = (long)puVar2 - (long)puVar14;
        if (sVar13 == (long)puVar3 - (long)cmp) {
          if (puVar14 == puVar2) {
            puVar14 = puVar15;
          }
          if (cmp == puVar3) {
            cmp = puVar15;
          }
          dVar6 = deMemoryEqual(puVar14,cmp,sVar13);
          pBVar4 = pBVar1;
          if (dVar6 != 0) {
            do {
              pBVar12 = pBVar11;
              pBVar11 = pBVar4;
              pBVar4 = pBVar11->nextSlot;
            } while (pBVar11->nextSlot != (BinaryIndexHashImplSlot *)0x0);
            iVar9 = pBVar11->numUsed + -1;
            pBVar1->keys[lVar10] = pBVar11->keys[iVar9];
            pBVar1->values[lVar10] = pBVar11->values[iVar9];
            pBVar11->numUsed = pBVar11->numUsed + -1;
            if (pBVar11->numUsed == 0) {
              if (pBVar12 == (BinaryIndexHashImplSlot *)0x0) {
                ppBVar7 = hash->slotTable + (int)uVar8;
              }
              else {
                ppBVar7 = &pBVar12->nextSlot;
              }
              *ppBVar7 = (BinaryIndexHashImplSlot *)0x0;
              pBVar11->nextSlot = hash->slotFreeList;
              hash->slotFreeList = pBVar11;
            }
            hash->numElements = hash->numElements + -1;
            return;
          }
          iVar9 = pBVar1->numUsed;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < iVar9);
    }
    ppBVar7 = &pBVar1->nextSlot;
    pBVar11 = pBVar1;
  } while( true );
}

Assistant:

BinaryIndexHash::BinaryIndexHash (void)
	: m_hash(BinaryIndexHashImpl_create(m_memPool.getRawPool()))
{
	if (!m_hash)
		throw std::bad_alloc();
}